

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::(anonymous_namespace)::DescriptorDatabaseTest_ConflictingTypeError_Test::
~DescriptorDatabaseTest_ConflictingTypeError_Test
          (DescriptorDatabaseTest_ConflictingTypeError_Test *this)

{
  protobuf::anon_unknown_0::DescriptorDatabaseTest_ConflictingTypeError_Test::
  ~DescriptorDatabaseTest_ConflictingTypeError_Test
            ((DescriptorDatabaseTest_ConflictingTypeError_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(DescriptorDatabaseTest, ConflictingTypeError) {
  AddToDatabase(
      "name: \"foo.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "}");
  AddToDatabaseWithError(
      "name: \"bar.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "}");
}